

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSearch.hpp
# Opt level: O0

void __thiscall QuantLib::LineSearch::LineSearch(LineSearch *this,RealType param_2)

{
  undefined8 *in_RDI;
  allocator_type *in_stack_ffffffffffffff98;
  DynamicVector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  DynamicVector<double,_std::allocator<double>_> *this_00;
  
  *in_RDI = &PTR__LineSearch_00503220;
  std::allocator<double>::allocator((allocator<double> *)0x26690b);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::allocator<double>::~allocator((allocator<double> *)0x266926);
  std::allocator<double>::allocator((allocator<double> *)0x266943);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::allocator<double>::~allocator((allocator<double> *)0x26695e);
  this_00 = (DynamicVector<double,_std::allocator<double>_> *)(in_RDI + 7);
  std::allocator<double>::allocator((allocator<double> *)0x26697b);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (this_00,in_stack_ffffffffffffff98);
  std::allocator<double>::~allocator((allocator<double> *)0x266996);
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  *(undefined1 *)(in_RDI + 0xc) = 1;
  return;
}

Assistant:

explicit LineSearch(RealType = 0.0) : qt_(0.0), qpt_(0.0), succeed_(true) {}